

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O0

void __thiscall Region::AllocateEHBailoutData(Region *this,Func *func,Instr *tryInstr)

{
  int iVar1;
  code *pcVar2;
  RegionType RVar3;
  bool bVar4;
  uint32 uVar5;
  Allocator *pAVar6;
  EHBailoutData *pEVar7;
  Region *pRVar8;
  undefined4 *puVar9;
  BranchInstr *pBVar10;
  LabelInstr *pLVar11;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  Instr *local_20;
  Instr *tryInstr_local;
  Func *func_local;
  Region *this_local;
  
  local_20 = tryInstr;
  tryInstr_local = (Instr *)func;
  func_local = (Func *)this;
  RVar3 = GetType(this);
  if (RVar3 == RegionTypeRoot) {
    pAVar6 = Func::GetNativeCodeDataAllocator((Func *)tryInstr_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Js::EHBailoutData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
               ,0x1b);
    pAVar6 = NativeCodeData::Allocator::TrackAllocInfo(pAVar6,&local_48);
    local_58 = NativeCodeData::AllocatorT<Js::EHBailoutData>::Alloc;
    local_50 = 0;
    pEVar7 = (EHBailoutData *)
             new<NativeCodeData::AllocatorT<Js::EHBailoutData>>
                       (0x20,(AllocatorT<Js::EHBailoutData> *)pAVar6,0x83db50);
    Js::EHBailoutData::EHBailoutData(pEVar7,-1,0,0,HT_None,(EHBailoutData *)0x0);
    this->ehBailoutData = pEVar7;
  }
  else {
    pAVar6 = Func::GetNativeCodeDataAllocator((Func *)tryInstr_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&Js::EHBailoutData::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
               ,0x1f);
    pAVar6 = NativeCodeData::Allocator::TrackAllocInfo(pAVar6,&local_80);
    pEVar7 = (EHBailoutData *)
             new<NativeCodeData::AllocatorT<Js::EHBailoutData>>
                       (0x20,(AllocatorT<Js::EHBailoutData> *)pAVar6,0x83db50);
    pRVar8 = GetParent(this);
    iVar1 = pRVar8->ehBailoutData->nestingDepth;
    pRVar8 = GetParent(this);
    Js::EHBailoutData::EHBailoutData(pEVar7,iVar1 + 1,0,0,HT_None,pRVar8->ehBailoutData);
    this->ehBailoutData = pEVar7;
    RVar3 = GetType(this);
    if (RVar3 == RegionTypeTry) {
      if (local_20 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                           ,0x22,"(tryInstr)","tryInstr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      if (local_20->m_opcode == TryCatch) {
        pBVar10 = IR::Instr::AsBranchInstr(local_20);
        pLVar11 = IR::BranchInstr::GetTarget(pBVar10);
        uVar5 = IR::Instr::GetByteCodeOffset(&pLVar11->super_Instr);
        this->ehBailoutData->catchOffset = uVar5;
      }
      else if (local_20->m_opcode == TryFinally) {
        pBVar10 = IR::Instr::AsBranchInstr(local_20);
        pLVar11 = IR::BranchInstr::GetTarget(pBVar10);
        uVar5 = IR::Instr::GetByteCodeOffset(&pLVar11->super_Instr);
        this->ehBailoutData->finallyOffset = uVar5;
      }
    }
    else {
      RVar3 = GetType(this);
      if (RVar3 == RegionTypeCatch) {
        this->ehBailoutData->ht = HT_Catch;
      }
      else {
        this->ehBailoutData->ht = HT_Finally;
      }
    }
  }
  return;
}

Assistant:

void
Region::AllocateEHBailoutData(Func * func, IR::Instr * tryInstr)
{
    if (this->GetType() == RegionTypeRoot)
    {
        this->ehBailoutData = NativeCodeDataNew(func->GetNativeCodeDataAllocator(), Js::EHBailoutData, -1 /*nestingDepth*/, 0 /*catchOffset*/, 0 /*finallyOffset*/, Js::HandlerType::HT_None, nullptr /*parent*/);
    }
    else
    {
        this->ehBailoutData = NativeCodeDataNew(func->GetNativeCodeDataAllocator(), Js::EHBailoutData, this->GetParent()->ehBailoutData->nestingDepth + 1, 0, 0, Js::HandlerType::HT_None, this->GetParent()->ehBailoutData);
        if (this->GetType() == RegionTypeTry)
        {
            Assert(tryInstr);
            if (tryInstr->m_opcode == Js::OpCode::TryCatch)
            {
                this->ehBailoutData->catchOffset = tryInstr->AsBranchInstr()->GetTarget()->GetByteCodeOffset(); // ByteCode offset of the Catch
            }
            else if (tryInstr->m_opcode == Js::OpCode::TryFinally)
            {
                this->ehBailoutData->finallyOffset = tryInstr->AsBranchInstr()->GetTarget()->GetByteCodeOffset(); // ByteCode offset of the Finally
            }
        }
        else if (this->GetType() == RegionTypeCatch)
        {
            this->ehBailoutData->ht = Js::HandlerType::HT_Catch;
        }
        else
        {
            this->ehBailoutData->ht = Js::HandlerType::HT_Finally;
        }
    }
}